

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tooltip.cxx
# Opt level: O2

void Fl_Tooltip::current(Fl_Widget *w)

{
  Fl_Widget *pFVar1;
  Fl_Group *pFVar2;
  
  exit_((Fl_Widget *)0x0);
  for (pFVar2 = (Fl_Group *)w;
      (pFVar1 = widget_, pFVar2 != (Fl_Group *)0x0 &&
      (pFVar1 = w, *(char **)((long)&pFVar2->super_Fl_Widget + 0x70) == (char *)0x0));
      pFVar2 = *(Fl_Group **)((long)&pFVar2->super_Fl_Widget + 8)) {
  }
  widget_ = pFVar1;
  return;
}

Assistant:

void Fl_Tooltip::current(Fl_Widget* w) {
#ifdef DEBUG
  printf("Fl_Tooltip::current(w=%p)\n", w);
#endif // DEBUG

  exit_(0);
  // find the enclosing group with a tooltip:
  Fl_Widget* tw = w;
  for (;;) {
    if (!tw) return;
    if (tw->tooltip()) break;
    tw = tw->parent();
  }
  // act just like Fl_Tooltip::enter_() except we can remember a zero:
  widget_ = w;
}